

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall tcu::Texture2D::allocLevel(Texture2D *this,int levelNdx)

{
  int height;
  int width;
  
  width = this->m_width >> ((byte)levelNdx & 0x1f);
  if (width < 2) {
    width = 1;
  }
  height = this->m_height >> ((byte)levelNdx & 0x1f);
  if (height < 2) {
    height = 1;
  }
  TextureLevelPyramid::allocLevel(&this->super_TextureLevelPyramid,levelNdx,width,height,1);
  return;
}

Assistant:

void Texture2D::allocLevel (int levelNdx)
{
	DE_ASSERT(de::inBounds(levelNdx, 0, getNumLevels()));

	const int	width	= getMipPyramidLevelSize(m_width, levelNdx);
	const int	height	= getMipPyramidLevelSize(m_height, levelNdx);

	TextureLevelPyramid::allocLevel(levelNdx, width, height, 1);
}